

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RowSetClear(RowSet *p)

{
  RowSetChunk *pRVar1;
  RowSetChunk *p_00;
  
  p_00 = p->pChunk;
  while (p_00 != (RowSetChunk *)0x0) {
    pRVar1 = p_00->pNextChunk;
    sqlite3DbFree(p->db,p_00);
    p_00 = pRVar1;
  }
  p->pChunk = (RowSetChunk *)0x0;
  p->nFresh = 0;
  p->rsFlags = 1;
  p->pForest = (RowSetEntry *)0x0;
  p->pEntry = (RowSetEntry *)0x0;
  p->pLast = (RowSetEntry *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowSetClear(RowSet *p){
  struct RowSetChunk *pChunk, *pNextChunk;
  for(pChunk=p->pChunk; pChunk; pChunk = pNextChunk){
    pNextChunk = pChunk->pNextChunk;
    sqlite3DbFree(p->db, pChunk);
  }
  p->pChunk = 0;
  p->nFresh = 0;
  p->pEntry = 0;
  p->pLast = 0;
  p->pForest = 0;
  p->rsFlags = ROWSET_SORTED;
}